

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

lua_Unsigned luaH_getn(Table *t)

{
  TValue *pTVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  lua_Unsigned lVar5;
  ulong key;
  ulong uVar6;
  
  uVar4 = (ulong)t->sizearray;
  if ((uVar4 == 0) || (t->array[t->sizearray - 1].tt_ != 0)) {
    if (t->lastfree != (Node *)0x0) {
      uVar6 = uVar4 + 1;
      while (key = uVar6, pTVar1 = luaH_getint(t,key), pTVar1->tt_ != 0) {
        if (key >> 0x3e != 0) {
          lVar5 = 0xffffffffffffffff;
          do {
            pTVar1 = luaH_getint(t,lVar5 + 2);
            lVar5 = lVar5 + 1;
          } while (pTVar1->tt_ != 0);
          return lVar5;
        }
        uVar6 = key * 2;
        uVar4 = key;
      }
      while (uVar6 = key, 1 < uVar6 - uVar4) {
        key = uVar4 + uVar6 >> 1;
        pTVar1 = luaH_getint(t,key);
        if (pTVar1->tt_ != 0) {
          uVar4 = key;
          key = uVar6;
        }
      }
    }
  }
  else {
    uVar3 = 0;
    while (uVar2 = uVar3, 1 < (int)uVar4 - uVar2) {
      uVar3 = uVar2 + (int)uVar4 >> 1;
      if (t->array[uVar3 - 1].tt_ == 0) {
        uVar4 = (ulong)uVar3;
        uVar3 = uVar2;
      }
    }
    uVar4 = (ulong)uVar2;
  }
  return uVar4;
}

Assistant:

lua_Unsigned luaH_getn (Table *t) {
  unsigned int j;
  j = t->sizearray;
  if (j > 0 && ttisnil(&t->array[j - 1])) {
    /* there is a boundary in the array part: (binary) search for it */
    unsigned int i = 0;
    while (j - i > 1) {
      unsigned int m = (i+j)/2;
      if (ttisnil(&t->array[m - 1])) j = m;
      else i = m;
    }
    return i;
  }
  /* else must find a boundary in hash part */
  else if (isdummy(t))  /* hash part is empty? */
    return j;  /* that is easy... */
  else return unbound_search(t, j);
}